

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_triangle
               (nk_draw_list *list,nk_vec2 a,nk_vec2 b,nk_vec2 c,nk_color col,float thickness)

{
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_color in_ESI;
  nk_draw_list *in_RDI;
  nk_draw_list_stroke in_XMM3_Da;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffe0;
  
  if ((in_RDI != (nk_draw_list *)0x0) && (in_ESI.a != '\0')) {
    pos.y = (float)in_ESI;
    pos.x = in_stack_ffffffffffffffe0;
    nk_draw_list_path_line_to(in_RDI,pos);
    pos_00.y = (float)in_ESI;
    pos_00.x = in_stack_ffffffffffffffe0;
    nk_draw_list_path_line_to(in_RDI,pos_00);
    pos_01.y = (float)in_ESI;
    pos_01.x = in_stack_ffffffffffffffe0;
    nk_draw_list_path_line_to(in_RDI,pos_01);
    nk_draw_list_path_stroke(in_RDI,in_ESI,in_XMM3_Da,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_triangle(struct nk_draw_list *list, struct nk_vec2 a,
struct nk_vec2 b, struct nk_vec2 c, struct nk_color col, float thickness)
{
NK_ASSERT(list);
if (!list || !col.a) return;
nk_draw_list_path_line_to(list, a);
nk_draw_list_path_line_to(list, b);
nk_draw_list_path_line_to(list, c);
nk_draw_list_path_stroke(list, col, NK_STROKE_CLOSED, thickness);
}